

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86.cpp
# Opt level: O3

int __thiscall
ncnn::BatchNorm_x86::forward_inplace(BatchNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  uint uVar9;
  float *pfVar10;
  uint uVar11;
  ulong uVar12;
  float *pfVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  float *pfVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  iVar3 = bottom_top_blob->elempack;
  iVar14 = bottom_top_blob->dims;
  iVar4 = bottom_top_blob->w;
  uVar9 = bottom_top_blob->h;
  iVar5 = bottom_top_blob->d;
  uVar6 = bottom_top_blob->c;
  if (iVar14 == 2) {
    if ((int)uVar9 < 1) {
      return 0;
    }
    uVar11 = iVar3 * iVar4;
    uVar12 = 0;
    do {
      pvVar7 = (this->super_BatchNorm).a_data.data;
      pvVar8 = (this->super_BatchNorm).b_data.data;
      fVar1 = *(float *)((long)pvVar7 + uVar12 * 4);
      fVar2 = *(float *)((long)pvVar8 + uVar12 * 4);
      fVar19 = fVar1;
      fVar20 = fVar1;
      fVar21 = fVar1;
      fVar22 = fVar1;
      fVar23 = fVar2;
      fVar24 = fVar2;
      fVar25 = fVar2;
      fVar26 = fVar2;
      if (iVar3 == 4) {
        pfVar13 = (float *)((long)pvVar7 + uVar12 * 0x10);
        pfVar10 = (float *)((long)pvVar8 + uVar12 * 0x10);
        fVar19 = *pfVar13;
        fVar20 = pfVar13[1];
        fVar21 = pfVar13[2];
        fVar22 = pfVar13[3];
        fVar23 = *pfVar10;
        fVar24 = pfVar10[1];
        fVar25 = pfVar10[2];
        fVar26 = pfVar10[3];
      }
      pfVar13 = (float *)((long)bottom_top_blob->w * uVar12 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      uVar18 = 0;
      if (3 < (int)uVar11) {
        iVar15 = 3;
        do {
          *pfVar13 = *pfVar13 * fVar23 + fVar19;
          pfVar13[1] = pfVar13[1] * fVar24 + fVar20;
          pfVar13[2] = pfVar13[2] * fVar25 + fVar21;
          pfVar13[3] = pfVar13[3] * fVar26 + fVar22;
          pfVar13 = pfVar13 + 4;
          iVar15 = iVar15 + 4;
          uVar18 = uVar11 & 0xfffffffc;
        } while (iVar15 < (int)uVar11);
      }
      if (uVar11 - uVar18 != 0 && (int)uVar18 <= (int)uVar11) {
        lVar16 = 0;
        do {
          pfVar13[lVar16] = pfVar13[lVar16] * fVar2 + fVar1;
          lVar16 = lVar16 + 1;
        } while (uVar11 - uVar18 != (int)lVar16);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar9);
  }
  else if (iVar14 == 1) {
    pfVar13 = (float *)bottom_top_blob->data;
    pfVar10 = (float *)(this->super_BatchNorm).a_data.data;
    pfVar17 = (float *)(this->super_BatchNorm).b_data.data;
    uVar18 = iVar3 * iVar4;
    uVar11 = 0;
    if (3 < (int)uVar18) {
      uVar11 = uVar18 & 0x7ffffffc;
      iVar15 = 3;
      do {
        fVar1 = pfVar10[1];
        fVar2 = pfVar10[2];
        fVar19 = pfVar10[3];
        fVar20 = pfVar17[1];
        fVar21 = pfVar17[2];
        fVar22 = pfVar17[3];
        *pfVar13 = *pfVar17 * *pfVar13 + *pfVar10;
        pfVar13[1] = fVar20 * pfVar13[1] + fVar1;
        pfVar13[2] = fVar21 * pfVar13[2] + fVar2;
        pfVar13[3] = fVar22 * pfVar13[3] + fVar19;
        pfVar13 = pfVar13 + 4;
        pfVar10 = pfVar10 + 4;
        pfVar17 = pfVar17 + 4;
        iVar15 = iVar15 + 4;
      } while (iVar15 < (int)uVar18);
    }
    if (uVar18 - uVar11 != 0 && (int)uVar11 <= (int)uVar18) {
      lVar16 = 0;
      do {
        pfVar13[lVar16] = pfVar13[lVar16] * pfVar17[lVar16] + pfVar10[lVar16];
        lVar16 = lVar16 + 1;
      } while (uVar18 - uVar11 != (int)lVar16);
    }
  }
  if ((iVar14 - 3U < 2) && (0 < (int)uVar6)) {
    uVar9 = iVar4 * iVar3 * uVar9 * iVar5;
    uVar12 = 0;
    do {
      pvVar7 = (this->super_BatchNorm).a_data.data;
      pvVar8 = (this->super_BatchNorm).b_data.data;
      fVar1 = *(float *)((long)pvVar7 + uVar12 * 4);
      fVar2 = *(float *)((long)pvVar8 + uVar12 * 4);
      fVar19 = fVar1;
      fVar20 = fVar1;
      fVar21 = fVar1;
      fVar22 = fVar1;
      fVar23 = fVar2;
      fVar24 = fVar2;
      fVar25 = fVar2;
      fVar26 = fVar2;
      if (iVar3 == 4) {
        pfVar13 = (float *)((long)pvVar7 + uVar12 * 0x10);
        pfVar10 = (float *)((long)pvVar8 + uVar12 * 0x10);
        fVar19 = *pfVar13;
        fVar20 = pfVar13[1];
        fVar21 = pfVar13[2];
        fVar22 = pfVar13[3];
        fVar23 = *pfVar10;
        fVar24 = pfVar10[1];
        fVar25 = pfVar10[2];
        fVar26 = pfVar10[3];
      }
      pfVar13 = (float *)(bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      uVar11 = 0;
      if (3 < (int)uVar9) {
        iVar14 = 3;
        do {
          *pfVar13 = *pfVar13 * fVar23 + fVar19;
          pfVar13[1] = pfVar13[1] * fVar24 + fVar20;
          pfVar13[2] = pfVar13[2] * fVar25 + fVar21;
          pfVar13[3] = pfVar13[3] * fVar26 + fVar22;
          pfVar13 = pfVar13 + 4;
          iVar14 = iVar14 + 4;
          uVar11 = uVar9 & 0xfffffffc;
        } while (iVar14 < (int)uVar9);
      }
      if (uVar9 - uVar11 != 0 && (int)uVar11 <= (int)uVar9) {
        lVar16 = 0;
        do {
          pfVar13[lVar16] = pfVar13[lVar16] * fVar2 + fVar1;
          lVar16 = lVar16 + 1;
        } while (uVar9 - uVar11 != (int)lVar16);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar6);
  }
  return 0;
}

Assistant:

int BatchNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}